

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_alloc_overflow_test(void)

{
  void *pvVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 local_90 [8];
  matras mat;
  matras_id_t id;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_overflow_test");
  plan(2);
  matras_create((matras *)local_90,0x10,&pta_allocator,(matras_stats *)0x0);
  uVar4 = 0xffffffffffffffff;
  while( true ) {
    pvVar1 = matras_alloc((matras *)local_90,(matras_id_t *)((long)&mat.stats + 4));
    if (uVar4 == 0xff) {
      _ok((uint)(pvVar1 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x156
          ,"line %d",0x156);
      _ok((uint)(mat.stats._4_4_ == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x157
          ,"line %d",0x157);
      matras_destroy((matras *)local_90);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_overflow_test");
      check_plan();
      return;
    }
    if (pvVar1 == (void *)0x0) break;
    uVar4 = uVar4 + 1;
    if (uVar4 != mat.stats._4_4_) {
      pcVar2 = "id == i";
      uVar3 = 0x153;
LAB_0010470c:
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar2,"false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              uVar3,"matras_alloc_overflow_test");
      exit(-1);
    }
  }
  pcVar2 = "data != NULL";
  uVar3 = 0x152;
  goto LAB_0010470c;
}

Assistant:

void
matras_alloc_overflow_test()
{
	header();
	plan(2);

	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
	for (size_t i = 0; i < max_capacity; i++) {
		void *data = matras_alloc(&mat, &id);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	/* Try to exceed the maximum capacity. */
	ok(matras_alloc(&mat, &id) == NULL);
	ok(id == max_capacity - 1);
	matras_destroy(&mat);

	footer();
	check_plan();
}